

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O2

bool __thiscall cmCTestBZR::RevnoParser::ProcessLine(RevnoParser *this)

{
  bool bVar1;
  string sStack_38;
  
  bVar1 = cmsys::RegularExpression::find(&this->RegexRevno,&(this->super_LineParser).Line);
  if (bVar1) {
    cmsys::RegularExpression::match_abi_cxx11_(&sStack_38,&this->RegexRevno,1);
    std::__cxx11::string::operator=((string *)this->Rev,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return true;
}

Assistant:

virtual bool ProcessLine()
    {
    if(this->RegexRevno.find(this->Line))
      {
      this->Rev = this->RegexRevno.match(1);
      }
    return true;
    }